

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_1
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  void *pvVar1;
  undefined8 *puVar2;
  double *pdVar3;
  long lVar4;
  SrcEvaluatorType srcEvaluator;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  ulong uVar9;
  VectorXd Rho_temp;
  VectorXd b4;
  MatrixXd L_6x4;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  assign_op<double,_double> local_299;
  Matrix<double,__1,_1,_0,__1,_1> local_298;
  DenseStorage<double,__1,__1,_1,_0> local_288;
  DenseStorage<double,__1,__1,__1,_0> local_278;
  SrcXprType local_258;
  ulong local_248;
  undefined8 uStack_240;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_238;
  
  local_278.m_data = (double *)0x0;
  local_278.m_rows = 0;
  local_278.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_278,0x18,6,4);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)local_278.m_data + lVar4) =
         *(undefined8 *)
          ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                 m_data.array + lVar4);
    *(undefined8 *)((long)local_278.m_data + lVar4 + local_278.m_rows * 8) =
         *(undefined8 *)
          ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                 m_data.array + lVar4 + 0x30);
    *(undefined8 *)((long)local_278.m_data + lVar4 + local_278.m_rows * 0x10) =
         *(undefined8 *)
          ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                 m_data.array + lVar4 + 0x90);
    *(undefined8 *)((long)local_278.m_data + lVar4 + local_278.m_rows * 0x18) =
         *(undefined8 *)
          ((long)(L_6x10->super_PlainObjectBase<Eigen::Matrix<double,_6,_10,_0,_6,_10>_>).m_storage.
                 m_data.array + lVar4 + 0x120);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x30);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_238,(MatrixType *)&local_278,0x14);
  local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pvVar1 = malloc(0x70);
  if (pvVar1 == (void *)0x0) {
    pdVar3 = (double *)0x0;
  }
  else {
    *(void **)(((ulong)pvVar1 & 0xffffffffffffffc0) + 0x38) = pvVar1;
    pdVar3 = (double *)(((ulong)pvVar1 & 0xffffffffffffffc0) + 0x40);
  }
  if (pdVar3 != (double *)0x0) {
    local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
    lVar4 = 0;
    do {
      pdVar3[lVar4] =
           (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
           array[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    local_258.m_rhs = &local_298;
    local_288 = (DenseStorage<double,__1,__1,_1,_0>)(ZEXT816(0) << 0x20);
    local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar3;
    local_258.m_dec =
         &local_238.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_288,
               local_238.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_cols,
               1);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_288,&local_258,&local_299);
    dVar5 = *local_288.m_data;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar5;
    if (0.0 <= dVar5) {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        auVar6 = vsqrtsd_avx(auVar6,auVar6);
        dVar5 = auVar6._0_8_;
      }
      *betas = dVar5;
      betas[1] = local_288.m_data[1] / dVar5;
      betas[2] = local_288.m_data[2] / dVar5;
      dVar7 = local_288.m_data[3];
    }
    else {
      auVar8._0_8_ = -dVar5;
      auVar8._8_8_ = 0x8000000000000000;
      if (-0.0 < dVar5) {
        local_248 = 0x8000000000000000;
        uStack_240 = 0x8000000000000000;
        dVar5 = sqrt(auVar8._0_8_);
        uVar9 = local_248;
      }
      else {
        auVar6 = vsqrtsd_avx(auVar8,auVar8);
        dVar5 = auVar6._0_8_;
        uVar9 = 0x8000000000000000;
      }
      *betas = dVar5;
      betas[1] = (double)((ulong)local_288.m_data[1] ^ uVar9) / dVar5;
      betas[2] = (double)((ulong)local_288.m_data[2] ^ uVar9) / dVar5;
      dVar7 = (double)((ulong)local_288.m_data[3] ^ uVar9);
    }
    betas[3] = dVar7 / dVar5;
    if (local_288.m_data != (double *)0x0) {
      free((void *)local_288.m_data[-1]);
    }
    if (local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (double *)0x0) {
      free((void *)local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[-1]);
    }
    Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_238);
    if (local_278.m_data != (double *)0x0) {
      free((void *)local_278.m_data[-1]);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = srand;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_1(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x4(6,4);

  for(int i = 0; i < 6; i++)
  {
    L_6x4(i,0) = L_6x10(i,0);
    L_6x4(i,1) = L_6x10(i,1);
    L_6x4(i,2) = L_6x10(i,3);
    L_6x4(i,3) = L_6x10(i,6);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x4,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b4 = SVD.solve(Rho_temp);

  if (b4[0] < 0)
  {
    betas[0] = sqrt(-b4[0]);
    betas[1] = -b4[1] / betas[0];
    betas[2] = -b4[2] / betas[0];
    betas[3] = -b4[3] / betas[0];
  }
  else
  {
    betas[0] = sqrt(b4[0]);
    betas[1] = b4[1] / betas[0];
    betas[2] = b4[2] / betas[0];
    betas[3] = b4[3] / betas[0];
  }
}